

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupAbsFlops(Gia_Man_t *p,Vec_Int_t *vFlopClasses)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(5000);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Vec_IntEntry(vFlopClasses,iVar7);
    if (iVar2 == 0) {
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar5->Value = uVar1;
    }
  }
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Vec_IntEntry(vFlopClasses,iVar7);
    if (iVar2 != 0) {
      uVar1 = Gia_ManAppendCi(p_00);
      pGVar5->Value = uVar1;
    }
  }
  Gia_ManHashAlloc(p_00);
  for (iVar7 = 0; iVar7 < p->vCos->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    Gia_ManDupAbsFlops_rec(p_00,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    Gia_ManAppendCo(p_00,iVar2);
  }
  iVar7 = 0;
  for (iVar2 = 0; iVar2 < p->nRegs; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar3 = Vec_IntEntry(vFlopClasses,iVar2);
    if (iVar3 != 0) {
      Gia_ManDupAbsFlops_rec(p_00,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      Gia_ManAppendCo(p_00,iVar3);
      iVar7 = iVar7 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,iVar7);
  pGVar6 = Gia_ManSeqCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsFlops( Gia_Man_t * p, Vec_Int_t * vFlopClasses )
{ 
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nFlops = 0;
    Gia_ManFillValue( p );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachRo( p, pObj, i )
        if ( !Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
            pObj->Value = Gia_ManAppendCi(pNew);
    // create POs
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachPo( p, pObj, i )
    {
        Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    // create RIs
    Gia_ManForEachRi( p, pObj, i )
        if ( Vec_IntEntry(vFlopClasses, i) )
        {
            Gia_ManDupAbsFlops_rec( pNew, Gia_ObjFanin0(pObj) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
            nFlops++;
        }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, nFlops );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}